

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

void main_cold_10(void)

{
  fprintf(_stderr,"%s ERROR: ",fileName);
  fwrite("fflush",6,1,_stderr);
  fputc(10,_stderr);
  exit(1);
}

Assistant:

static void printHeader(FILE * sockfile,URL_S * url) {
	char header[2092] = { 0 };
	sprintf(header, "GET /%s HTTP/1.1\r\nHost: "
		"%s\r\n"
		"Connection: close\r\n\r\n", url->file, url->url);

	if (fputs(header, sockfile) == EOF)
		ERROR_EXIT("fputs");

	if (fflush(sockfile) == EOF)
		ERROR_EXIT("fflush");
}